

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_func_exists(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  SyHashEntry *pSVar1;
  int local_40;
  sxu32 local_3c;
  int res;
  int nLen;
  jx9_vm *pVm;
  char *zName;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zName = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (0 < nArg) {
    _res = pCtx->pVm;
    pVm = (jx9_vm *)jx9_value_to_string(*apArg,(int *)&local_3c);
    local_40 = 0;
    pSVar1 = SyHashGet(&_res->hFunction,pVm,local_3c);
    if ((pSVar1 != (SyHashEntry *)0x0) ||
       (pSVar1 = SyHashGet(&_res->hHostFunction,pVm,local_3c), pSVar1 != (SyHashEntry *)0x0)) {
      local_40 = 1;
    }
    jx9_result_bool(pjStack_18,local_40);
    return 0;
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int vm_builtin_func_exists(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zName;
	jx9_vm *pVm;
	int nLen;
	int res;
	if( nArg < 1 ){
		/* Missing argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Point to the target VM */
	pVm = pCtx->pVm;
	/* Extract the function name */
	zName = jx9_value_to_string(apArg[0], &nLen);
	/* Assume the function is not defined */
	res = 0;
	/* Perform the lookup */
	if( SyHashGet(&pVm->hFunction, (const void *)zName, (sxu32)nLen) != 0 ||
		SyHashGet(&pVm->hHostFunction, (const void *)zName, (sxu32)nLen) != 0 ){
			/* Function is defined */
			res = 1;
	}
	jx9_result_bool(pCtx, res);
	return SXRET_OK;
}